

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharacterBuffer.h
# Opt level: O2

hash_t __thiscall JsUtil::CharacterBuffer::operator_cast_to_unsigned_int(CharacterBuffer *this)

{
  code *pcVar1;
  bool bVar2;
  hash_t hVar3;
  undefined4 *puVar4;
  char16_t *s;
  
  s = *(char16_t **)this;
  if (s == (char16_t *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/CharacterBuffer.h"
                       ,0x20,"(string != nullptr)","string != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    s = *(char16_t **)this;
  }
  hVar3 = CharacterBuffer<char16_t>::InternalGetHashCode<false>(s,*(charcount_t *)(this + 8));
  return hVar3;
}

Assistant:

operator hash_t() const
        {
            Assert(string != nullptr);
            return StaticGetHashCode(string, len);
        }